

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void filterScanline(uchar *out,uchar *scanline,uchar *prevline,size_t length,size_t bytewidth,
                   uchar filterType)

{
  uchar uVar1;
  uchar uVar2;
  size_t sVar3;
  long lVar4;
  undefined7 in_register_00000089;
  
  switch(CONCAT71(in_register_00000089,filterType) & 0xffffffff) {
  case 0:
    for (sVar3 = 0; length != sVar3; sVar3 = sVar3 + 1) {
      out[sVar3] = scanline[sVar3];
    }
    break;
  case 1:
    for (sVar3 = 0; bytewidth != sVar3; sVar3 = sVar3 + 1) {
      out[sVar3] = scanline[sVar3];
    }
    for (lVar4 = 0; bytewidth + lVar4 < length; lVar4 = lVar4 + 1) {
      out[lVar4 + bytewidth] = scanline[lVar4 + bytewidth] - scanline[lVar4];
    }
    break;
  case 2:
    sVar3 = 0;
    if (prevline == (uchar *)0x0) {
      for (; length != sVar3; sVar3 = sVar3 + 1) {
        out[sVar3] = scanline[sVar3];
      }
    }
    else {
      for (; length != sVar3; sVar3 = sVar3 + 1) {
        out[sVar3] = scanline[sVar3] - prevline[sVar3];
      }
    }
    break;
  case 3:
    sVar3 = 0;
    if (prevline == (uchar *)0x0) {
      for (; bytewidth != sVar3; sVar3 = sVar3 + 1) {
        out[sVar3] = scanline[sVar3];
      }
      for (lVar4 = 0; bytewidth + lVar4 < length; lVar4 = lVar4 + 1) {
        out[lVar4 + bytewidth] = scanline[lVar4 + bytewidth] - (scanline[lVar4] >> 1);
      }
    }
    else {
      for (; bytewidth != sVar3; sVar3 = sVar3 + 1) {
        out[sVar3] = scanline[sVar3] - (prevline[sVar3] >> 1);
      }
      for (lVar4 = 0; bytewidth + lVar4 < length; lVar4 = lVar4 + 1) {
        out[lVar4 + bytewidth] =
             scanline[lVar4 + bytewidth] -
             (char)((uint)prevline[lVar4 + bytewidth] + (uint)scanline[lVar4] >> 1);
      }
    }
    break;
  case 4:
    sVar3 = 0;
    if (prevline == (uchar *)0x0) {
      for (; bytewidth != sVar3; sVar3 = sVar3 + 1) {
        out[sVar3] = scanline[sVar3];
      }
      for (lVar4 = 0; bytewidth + lVar4 < length; lVar4 = lVar4 + 1) {
        out[lVar4 + bytewidth] = scanline[lVar4 + bytewidth] - scanline[lVar4];
      }
    }
    else {
      for (; bytewidth != sVar3; sVar3 = sVar3 + 1) {
        out[sVar3] = scanline[sVar3] - prevline[sVar3];
      }
      for (lVar4 = 0; bytewidth + lVar4 < length; lVar4 = lVar4 + 1) {
        uVar1 = scanline[lVar4 + bytewidth];
        uVar2 = paethPredictor((ushort)scanline[lVar4],(ushort)prevline[lVar4 + bytewidth],
                               (ushort)prevline[lVar4]);
        out[lVar4 + bytewidth] = uVar1 - uVar2;
      }
    }
  }
  return;
}

Assistant:

static void filterScanline(unsigned char* out, const unsigned char* scanline, const unsigned char* prevline,
                           size_t length, size_t bytewidth, unsigned char filterType) {
  size_t i;
  switch(filterType) {
    case 0: /*None*/
      for(i = 0; i != length; ++i) out[i] = scanline[i];
      break;
    case 1: /*Sub*/
      for(i = 0; i != bytewidth; ++i) out[i] = scanline[i];
      for(i = bytewidth; i < length; ++i) out[i] = scanline[i] - scanline[i - bytewidth];
      break;
    case 2: /*Up*/
      if(prevline) {
        for(i = 0; i != length; ++i) out[i] = scanline[i] - prevline[i];
      } else {
        for(i = 0; i != length; ++i) out[i] = scanline[i];
      }
      break;
    case 3: /*Average*/
      if(prevline) {
        for(i = 0; i != bytewidth; ++i) out[i] = scanline[i] - (prevline[i] >> 1);
        for(i = bytewidth; i < length; ++i) out[i] = scanline[i] - ((scanline[i - bytewidth] + prevline[i]) >> 1);
      } else {
        for(i = 0; i != bytewidth; ++i) out[i] = scanline[i];
        for(i = bytewidth; i < length; ++i) out[i] = scanline[i] - (scanline[i - bytewidth] >> 1);
      }
      break;
    case 4: /*Paeth*/
      if(prevline) {
        /*paethPredictor(0, prevline[i], 0) is always prevline[i]*/
        for(i = 0; i != bytewidth; ++i) out[i] = (scanline[i] - prevline[i]);
        for(i = bytewidth; i < length; ++i) {
          out[i] = (scanline[i] - paethPredictor(scanline[i - bytewidth], prevline[i], prevline[i - bytewidth]));
        }
      } else {
        for(i = 0; i != bytewidth; ++i) out[i] = scanline[i];
        /*paethPredictor(scanline[i - bytewidth], 0, 0) is always scanline[i - bytewidth]*/
        for(i = bytewidth; i < length; ++i) out[i] = (scanline[i] - scanline[i - bytewidth]);
      }
      break;
    default: return; /*nonexistent filter type given*/
  }
}